

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fDrawBuffersIndexedTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::DrawBuffersIndexedTest::iterate
          (DrawBuffersIndexedTest *this)

{
  undefined8 log_00;
  TestLog *log_01;
  RenderContext *renderContext;
  allocator<char> local_89;
  string local_88;
  undefined1 local_68 [8];
  ResultCollector results;
  TestLog *log;
  DrawBuffersIndexedTest *this_local;
  
  log_01 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  results.m_message.field_2._8_8_ = log_01;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"",&local_89);
  tcu::ResultCollector::ResultCollector((ResultCollector *)local_68,log_01,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  log_00 = results.m_message.field_2._8_8_;
  renderContext = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  anon_unknown_0::runTest
            ((TestLog *)log_00,(ResultCollector *)local_68,renderContext,
             &this->m_preCommonBlendState,&this->m_postCommonBlendState,&this->m_drawBuffers);
  tcu::ResultCollector::setTestContextResult
            ((ResultCollector *)local_68,
             (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  tcu::ResultCollector::~ResultCollector((ResultCollector *)local_68);
  return STOP;
}

Assistant:

TestCase::IterateResult DrawBuffersIndexedTest::iterate (void)
{
	TestLog&				log		= m_testCtx.getLog();
	tcu::ResultCollector	results	(log);

	runTest(log, results, m_context.getRenderContext(), m_preCommonBlendState, m_postCommonBlendState, m_drawBuffers);

	results.setTestContextResult(m_testCtx);

	return STOP;
}